

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ContNew * __thiscall wasm::Builder::makeContNew(Builder *this,HeapType type,Expression *func)

{
  ContNew *this_00;
  Type local_30;
  
  this_00 = MixedArena::alloc<wasm::ContNew>(&this->wasm->allocator);
  wasm::Type::Type(&local_30,type,NonNullable,Inexact);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type.id =
       local_30.id;
  this_00->func = func;
  ContNew::finalize(this_00);
  return this_00;
}

Assistant:

ContNew* makeContNew(HeapType type, Expression* func) {
    auto* ret = wasm.allocator.alloc<ContNew>();
    ret->type = Type(type, NonNullable);
    ret->func = func;
    ret->finalize();
    return ret;
  }